

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::
MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
::ParseValue(MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
             *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *values_)

{
  bool bVar1;
  ostream *poVar2;
  MapError *this_00;
  pointer pvVar3;
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream problem;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
  local_60;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_true>
  local_58;
  const_iterator it;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  string *value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values__local;
  MapFlagList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_args::detail::vector,_args::ValueReader,_args::detail::unordered_map>
  *this_local;
  
  key.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::at(values_,0);
  std::__cxx11::string::string((string *)local_40);
  ValueReader::operator()
            ((ValueReader *)&this->field_0x178,
             &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name,
             (string *)key.field_2._8_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  local_58._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>_>_>
       ::find(&this->map,(key_type *)local_40);
  local_60._M_cur =
       (__node_type *)
       std::
       end<std::unordered_map<std::__cxx11::string,MappingEnum,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,MappingEnum>>>>
                 (&this->map);
  bVar1 = std::__detail::operator==(&local_58,&local_60);
  if (!bVar1) {
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum>,_false,_true>
                           *)&local_58);
    std::vector<MappingEnum,std::allocator<MappingEnum>>::emplace_back<MappingEnum_const&>
              ((vector<MappingEnum,std::allocator<MappingEnum>> *)&this->values,&pvVar3->second);
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  poVar2 = std::operator<<((ostream *)local_1d8,"Could not find key \'");
  poVar2 = std::operator<<(poVar2,(string *)local_40);
  poVar2 = std::operator<<(poVar2,"\' in map for arg \'");
  poVar2 = std::operator<<(poVar2,(string *)
                                  &(this->super_ValueFlagBase).super_FlagBase.super_NamedBase.name);
  std::operator<<(poVar2,"\'");
  this_00 = (MapError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  MapError::MapError(this_00,&local_1f8);
  __cxa_throw(this_00,&MapError::typeinfo,MapError::~MapError);
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &values_) override
            {
                const std::string &value = values_.at(0);

                K key;
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value, key))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value, key);
#endif
                auto it = map.find(key);
                if (it == std::end(map))
                {
                    std::ostringstream problem;
                    problem << "Could not find key '" << key << "' in map for arg '" << name << "'";
#ifdef ARGS_NOEXCEPT
                    error = Error::Map;
                    errorMsg = problem.str();
#else
                    throw MapError(problem.str());
#endif
                } else
                {
                    this->values.emplace_back(it->second);
                }
            }